

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.hh
# Opt level: O2

bool ConditionMarker::varnodeComplement(Varnode *a,Varnode *b)

{
  uintb uVar1;
  uintb uVar2;
  bool bVar3;
  
  if (((a->flags & 2) == 0) || ((b->flags & 2) == 0)) {
    if (((((a->flags & 0x10) != 0) && (a->def->opcode->opcode == CPUI_BOOL_NEGATE)) &&
        (*(a->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_start == b)) ||
       ((((b->flags & 0x10) != 0 && (b->def->opcode->opcode == CPUI_BOOL_NEGATE)) &&
        (*(b->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
          super__Vector_impl_data._M_start == a)))) {
      return true;
    }
    bVar3 = false;
  }
  else {
    uVar1 = (a->loc).offset;
    uVar2 = (b->loc).offset;
    bVar3 = true;
    if (uVar2 != 1 || uVar1 != 0) {
      return uVar1 == 1 && uVar2 == 0;
    }
  }
  return bVar3;
}

Assistant:

bool isIllegalInput(void) const { return ((flags&(Varnode::input|Varnode::directwrite))==Varnode::input); }